

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Cord::AppendImpl<absl::lts_20240722::Cord>(Cord *this,Cord *src)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  SamplingState *pSVar4;
  CordzInfo *pCVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  uint8_t *puVar9;
  Nonnull<cord_internal::CordRep_*> tree;
  CordRep *pCVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dd;
  string_view src_00;
  ChunkIterator __begin0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  Nullable<absl::cord_internal::CordRep_*> local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  pCVar10 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar10 != (CordRep *)0x0 && ((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) &&
     (pCVar10->length == 0)) goto LAB_00111747;
  do {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar3 = (ulong)(char)bVar1;
    if ((uVar3 & 1) == 0) {
      uVar7 = uVar3 >> 1;
    }
    else {
      uVar7 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar7 == 0) {
      return;
    }
    uVar7 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar7 & 1) == 0) {
      uVar7 = uVar7 >> 1;
    }
    else {
      uVar7 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (uVar7 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar10;
      }
      else {
        pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        pCVar5 = cord_internal::InlineData::cordz_info((InlineData *)src);
        if (pCVar5 != (CordzInfo *)0x0) {
          absl::lts_20240722::cord_internal::CordzInfo::Untrack();
        }
        ((CordRepBtreeReader *)src)->remaining_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
        if (pCVar10 == (CordRep *)0x0) goto LAB_00111817;
        if (pCVar10->tag == '\x02') {
          AppendImpl<absl::lts_20240722::Cord>();
          pCVar10 = (CordRep *)local_b8._0_8_;
        }
        if (pCVar10 == (CordRep *)0x0) {
          __assert_fail("rep",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                        ,0x4f2,
                        "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                       );
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar10;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        pSVar4 = (SamplingState *)__tls_get_addr(&PTR_0011efd0);
        if (pSVar4->next_sample < 2) {
          lVar6 = absl::lts_20240722::cord_internal::cordz_should_profile_slow(pSVar4);
        }
        else {
          pSVar4->next_sample = pSVar4->next_sample + -1;
          lVar6 = 0;
        }
        if (0 < lVar6) {
          absl::lts_20240722::cord_internal::CordzInfo::TrackCord
                    ((InlineData *)this,kAppendCord,lVar6);
          return;
        }
      }
      return;
    }
    if ((uVar3 & 1) == 0) {
      uVar7 = uVar3 >> 1;
    }
    else {
      uVar7 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    tree = *(Nonnull<cord_internal::CordRep_*> *)&((CordRepBtreeReader *)src)->navigator_;
    if (0x1ff < uVar7) {
      if ((bVar1 & 1) == 0) {
        tree = (Nonnull<cord_internal::CordRep_*>)0x0;
      }
      else {
        pCVar5 = cord_internal::InlineData::cordz_info((InlineData *)src);
        if (pCVar5 != (CordzInfo *)0x0) {
          absl::lts_20240722::cord_internal::CordzInfo::Untrack();
        }
      }
      ((CordRepBtreeReader *)src)->remaining_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
      if (tree != (Nonnull<cord_internal::CordRep_*>)0x0) {
        if (tree->tag == '\x02') {
          AppendImpl<absl::lts_20240722::Cord>();
          tree = (Nonnull<cord_internal::CordRep_*>)local_b8._0_8_;
        }
        InlineRep::AppendTree(&this->contents_,tree,kAppendCord);
        return;
      }
LAB_00111817:
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
    }
    if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || (bVar1 & 1) == 0) {
      puVar9 = (uint8_t *)0x0;
      if ((bVar1 & 1) == 0) {
        puVar9 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
      }
LAB_001115cc:
      src_00._M_str = (char *)puVar9;
      src_00._M_len = uVar7;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    bVar2 = tree->tag;
    if (5 < bVar2) {
      if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar9 = tree->storage;
      goto LAB_001115cc;
    }
    if (src == this) {
      Cord((Cord *)local_b8,src);
      AppendImpl<absl::lts_20240722::Cord>(this,(Cord *)local_b8);
      ~Cord((Cord *)local_b8);
      return;
    }
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    local_a8 = (Nullable<absl::cord_internal::CordRep_*>)0x0;
    sStack_a0 = 0;
    _local_b8 = (string_view)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || (bVar1 & 1) == 0) {
      if ((bVar1 & 1) == 0) {
        sStack_a0 = uVar3 >> 1;
        stack0xffffffffffffff50 = (char *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
        local_b8._0_8_ = sStack_a0;
      }
      else {
        AppendImpl<absl::lts_20240722::Cord>();
        uVar11 = extraout_XMM0_Da;
        uVar12 = extraout_XMM0_Db;
        uVar13 = extraout_XMM0_Dc;
        uVar14 = extraout_XMM0_Dd;
LAB_001117d0:
        local_b8._4_4_ = uVar12;
        local_b8._0_4_ = uVar11;
        local_b8._8_4_ = uVar13;
        uStack_ac = uVar14;
      }
    }
    else {
      sStack_a0 = tree->length;
      if (sStack_a0 == 0) goto LAB_001117d0;
      ChunkIterator::InitTree((ChunkIterator *)local_b8,tree);
    }
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    while (InlineRep::AppendArray(&this->contents_,_local_b8,kAppendString), sStack_a0 != 0) {
      sVar8 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8._0_8_) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      sStack_a0 = sVar8;
      if (sVar8 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8._0_8_ == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          _local_b8 = (string_view)ZEXT816(0);
        }
        else {
          _local_b8 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::lts_20240722::Cord>();
LAB_00111747:
    AppendImpl<absl::lts_20240722::Cord>();
  } while( true );
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}